

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O2

void __thiscall cmGeneratedFileStreamBase::Open(cmGeneratedFileStreamBase *this,string *name)

{
  string *source;
  string dir;
  string local_30;
  
  std::__cxx11::string::_M_assign((string *)this);
  source = &this->TempName;
  std::__cxx11::string::_M_assign((string *)source);
  std::__cxx11::string::append((char *)source);
  cmsys::SystemTools::RemoveFile(source);
  cmsys::SystemTools::GetFilenamePath(&local_30,source);
  cmsys::SystemTools::MakeDirectory(&local_30,(mode_t *)0x0);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void cmGeneratedFileStreamBase::Open(std::string const& name)
{
  // Save the original name of the file.
  this->Name = name;

  // Create the name of the temporary file.
  this->TempName = name;
#if defined(__VMS)
  this->TempName += "_tmp";
#else
  this->TempName += ".tmp";
#endif

  // Make sure the temporary file that will be used is not present.
  cmSystemTools::RemoveFile(this->TempName);

  std::string dir = cmSystemTools::GetFilenamePath(this->TempName);
  cmSystemTools::MakeDirectory(dir);
}